

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fCopyImageTests.cpp
# Opt level: O0

void deqp::gles31::Functional::anon_unknown_0::genImage
               (Functions *gl,Random *rng,deUint32 name,
               vector<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
               *levels,ImageInfo *info,deUint32 moreRestrictiveFormat)

{
  bool bVar1;
  deUint32 target;
  deUint32 moreRestrictiveFormat_local;
  ImageInfo *info_local;
  vector<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
  *levels_local;
  deUint32 name_local;
  Random *rng_local;
  Functions *gl_local;
  
  target = ImageInfo::getTarget(info);
  bVar1 = isTextureTarget(target);
  if (bVar1) {
    genTextureImage(gl,rng,name,levels,info,moreRestrictiveFormat);
  }
  else {
    genRenderbufferImage(gl,rng,name,levels,info,moreRestrictiveFormat);
  }
  return;
}

Assistant:

void genImage (const glw::Functions&			gl,
			   de::Random&						rng,
			   deUint32							name,
			   vector<ArrayBuffer<deUint8> >&	levels,
			   const ImageInfo&					info,
			   deUint32							moreRestrictiveFormat)
{
	if (isTextureTarget(info.getTarget()))
		genTextureImage(gl, rng, name, levels, info, moreRestrictiveFormat);
	else
		genRenderbufferImage(gl, rng, name, levels, info, moreRestrictiveFormat);
}